

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_string.c
# Opt level: O0

int mk_string_itop(uint64_t value,mk_ptr_t *p)

{
  uint32_t uVar1;
  int iVar2;
  char *pcVar3;
  int i_1;
  int i;
  char *dst;
  uint32_t next;
  uint32_t length;
  mk_ptr_t *p_local;
  uint64_t value_local;
  
  uVar1 = digits10(value);
  dst._0_4_ = uVar1 - 1;
  pcVar3 = p->data;
  p_local = (mk_ptr_t *)value;
  while ((mk_ptr_t *)0x63 < p_local) {
    iVar2 = (int)((ulong)p_local % 100 << 1);
    p_local = (mk_ptr_t *)((ulong)p_local / 100);
    pcVar3[(uint)dst] =
         "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
         [iVar2 + 1];
    pcVar3[(uint)dst - 1] =
         "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
         [iVar2];
    dst._0_4_ = (uint)dst - 2;
  }
  if (p_local < (mk_ptr_t *)0xa) {
    pcVar3[(uint)dst] = (char)p_local + '0';
  }
  else {
    iVar2 = (int)p_local * 2;
    pcVar3[(uint)dst] =
         "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
         [iVar2 + 1];
    pcVar3[(uint)dst - 1] =
         "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
         [iVar2];
  }
  pcVar3 = p->data + uVar1;
  *pcVar3 = '\r';
  pcVar3[1] = '\n';
  pcVar3[2] = '\0';
  p->len = (unsigned_long)(pcVar3 + (2 - (long)p->data));
  return (int)p->len;
}

Assistant:

int mk_string_itop(uint64_t value, mk_ptr_t *p)
{
    static const char digits[201] =
        "0001020304050607080910111213141516171819"
        "2021222324252627282930313233343536373839"
        "4041424344454647484950515253545556575859"
        "6061626364656667686970717273747576777879"
        "8081828384858687888990919293949596979899";

    uint32_t const length = digits10(value);
    uint32_t next = length - 1;
    char *dst = p->data;

    while (value >= 100) {
        int const i = (value % 100) * 2;
        value /= 100;
        dst[next] = digits[i + 1];
        dst[next - 1] = digits[i];
        next -= 2;
    }

    /* Handle last 1-2 digits */
    if (value < 10) {
        dst[next] = '0' + (uint32_t) value;
    }
    else {
        int i = (uint32_t) value * 2;
        dst[next] = digits[i + 1];
        dst[next - 1] = digits[i];
    }

    dst = p->data + length;
    *dst++ = '\r';
    *dst++ = '\n';
    *dst++ = '\0';

    p->len = (dst - p->data - 1);
    return p->len;
}